

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O1

void __thiscall Nova::Parse_Args::Print_Usage(Parse_Args *this,bool do_exit)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer pbVar5;
  size_type *psVar6;
  long lVar7;
  int iVar8;
  pointer pAVar9;
  ulong uVar10;
  bool bVar11;
  
  poVar3 = Log::(anonymous_namespace)::cerr;
  std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr,"Usage: ",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(this->program_name)._M_dataplus._M_p,
                      (this->program_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pAVar9 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar9) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      Arg_Data::Print_Synopsis((Arg_Data *)((long)&pAVar9->type + lVar7));
      std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr," ",1);
      uVar10 = uVar10 + 1;
      pAVar9 = (this->arg_data_list).
               super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->arg_data_list).
                     super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pAVar9 >> 3) * 0x6f96f96f96f96f97;
      lVar7 = lVar7 + 0x138;
    } while (uVar10 <= uVar4 && uVar4 - uVar10 != 0);
  }
  pbVar5 = (this->extra_args_synopsis_list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->extra_args_synopsis_list).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    lVar7 = 8;
    uVar10 = 0;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (Log::(anonymous_namespace)::cerr,*(char **)((long)pbVar5 + lVar7 + -8),
                          *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar7));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar10 = uVar10 + 1;
      pbVar5 = (this->extra_args_synopsis_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x20;
    } while (uVar10 < (ulong)((long)(this->extra_args_synopsis_list).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5))
    ;
  }
  cVar1 = (char)Log::(anonymous_namespace)::cerr;
  std::ios::widen((char)*(undefined8 *)(*(long *)Log::(anonymous_namespace)::cerr + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  pAVar9 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->arg_data_list).
                super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pAVar9;
  if (lVar7 == 0) {
    iVar8 = 0;
  }
  else {
    lVar7 = (lVar7 >> 3) * 0x6f96f96f96f96f97;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    psVar6 = &(pAVar9->str)._M_string_length;
    iVar8 = 0;
    do {
      iVar2 = (int)*psVar6;
      if ((int)*psVar6 < iVar8) {
        iVar2 = iVar8;
      }
      iVar8 = iVar2;
      psVar6 = psVar6 + 0x27;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  lVar7 = (long)(this->extra_args_desc_list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->extra_args_desc_list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 5;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    psVar6 = &((this->extra_args_synopsis_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    do {
      iVar2 = (int)*psVar6;
      if ((int)*psVar6 < iVar8) {
        iVar2 = iVar8;
      }
      iVar8 = iVar2;
      psVar6 = psVar6 + 4;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pAVar9 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar9) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      Arg_Data::Print_Description((Arg_Data *)((long)&pAVar9->type + lVar7),iVar8 + 2);
      cVar1 = (char)Log::(anonymous_namespace)::cerr;
      std::ios::widen((char)*(undefined8 *)(*(long *)Log::(anonymous_namespace)::cerr + -0x18) +
                      cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar10 = uVar10 + 1;
      pAVar9 = (this->arg_data_list).
               super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->arg_data_list).
                     super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pAVar9 >> 3) * 0x6f96f96f96f96f97;
      lVar7 = lVar7 + 0x138;
    } while (uVar10 <= uVar4 && uVar4 - uVar10 != 0);
  }
  if ((this->extra_args_desc_list).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->extra_args_desc_list).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      pbVar5 = (this->extra_args_synopsis_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (Log::(anonymous_namespace)::cerr,pbVar5[uVar10]._M_dataplus._M_p,
                 pbVar5[uVar10]._M_string_length);
      if ((this->extra_args_synopsis_list).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length != (ulong)(iVar8 + 2))
      {
        uVar4 = 2;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr," ",1)
          ;
          bVar11 = uVar4 <= (ulong)(iVar8 + 2) -
                            (this->extra_args_synopsis_list).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (bVar11);
      }
      pbVar5 = (this->extra_args_desc_list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (Log::(anonymous_namespace)::cerr,pbVar5[uVar10]._M_dataplus._M_p,
                          pbVar5[uVar10]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(this->extra_args_desc_list).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->extra_args_desc_list).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (this->extra_usage_callback != (_func_void *)0x0) {
    (*this->extra_usage_callback)();
  }
  if (do_exit) {
    exit(-1);
  }
  return;
}

Assistant:

void Parse_Args::
Print_Usage(bool do_exit) const
{
    int i;
    Log::cerr<<"Usage: "<<program_name<<" ";
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Synopsis();
        Log::cerr<<" ";
    }
    for(i=0;i<extra_args_synopsis_list.size();i++) Log::cerr<<extra_args_synopsis_list[i]<<" ";
    Log::cerr<<std::endl;

    int width=0,len;
    for(i=0;i<arg_data_list.size();i++)
    {
        len=(int)arg_data_list[i].str.length();
        if(len>width) width=len;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        len=(int)extra_args_synopsis_list[i].length();
        if(len>width) width=len;
    }
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Description(width+2);
        Log::cerr<<std::endl;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        Log::cerr<<extra_args_synopsis_list[i];
        for(unsigned j=1;j<=width+2-extra_args_synopsis_list[i].length();j++) Log::cerr<<" ";
        Log::cerr<<extra_args_desc_list[i]<<std::endl;
    }
    if(extra_usage_callback) extra_usage_callback();
    if(do_exit) exit(-1);
}